

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

char * get_current_charset(archive_conflict *a)

{
  uint uVar1;
  char *pcVar2;
  char *local_18;
  char *cur_charset;
  archive_conflict *a_local;
  
  if (a == (archive_conflict *)0x0) {
    local_18 = default_iconv_charset("");
  }
  else {
    local_18 = default_iconv_charset(a->current_code);
    if (a->current_code == (char *)0x0) {
      pcVar2 = strdup(local_18);
      a->current_code = pcVar2;
      uVar1 = get_current_codepage();
      a->current_codepage = uVar1;
      uVar1 = get_current_oemcp();
      a->current_oemcp = uVar1;
    }
  }
  return local_18;
}

Assistant:

static const char *
get_current_charset(struct archive *a)
{
	const char *cur_charset;

	if (a == NULL)
		cur_charset = default_iconv_charset("");
	else {
		cur_charset = default_iconv_charset(a->current_code);
		if (a->current_code == NULL) {
			a->current_code = strdup(cur_charset);
			a->current_codepage = get_current_codepage();
			a->current_oemcp = get_current_oemcp();
		}
	}
	return (cur_charset);
}